

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O0

Log * __thiscall FIX::FileLogFactory::create(FileLogFactory *this)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  Dictionary *this_00;
  ConfigError *anon_var_0;
  string local_100;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string backupPath;
  string local_70;
  undefined1 local_50 [8];
  string path;
  Dictionary *settings;
  FileLogFactory *this_local;
  
  iVar3 = this->m_globalLogCount + 1;
  this->m_globalLogCount = iVar3;
  if (iVar3 < 2) {
    lVar4 = std::__cxx11::string::size();
    if (lVar4 == 0) {
      this_00 = SessionSettings::get(&this->m_settings);
      path.field_2._8_8_ = this_00;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"FileLogPath",
                 (allocator<char> *)(backupPath.field_2._M_local_buf + 0xf));
      Dictionary::getString((string *)local_50,this_00,&local_70,false);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator((allocator<char> *)(backupPath.field_2._M_local_buf + 0xf));
      std::__cxx11::string::string((string *)local_98,(string *)local_50);
      uVar1 = path.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"FileLogBackupPath",&local_b9);
      bVar2 = Dictionary::has((Dictionary *)uVar1,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      uVar1 = path.field_2._8_8_;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"FileLogBackupPath",
                   (allocator<char> *)((long)&anon_var_0 + 7));
        Dictionary::getString(&local_e0,(Dictionary *)uVar1,&local_100,false);
        std::__cxx11::string::operator=((string *)local_98,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      }
      this_local = (FileLogFactory *)operator_new(0x488);
      FileLog::FileLog((FileLog *)this_local,(string *)local_50,(string *)local_98);
      this->m_globalLog = (Log *)this_local;
      std::__cxx11::string::~string((string *)local_98);
      std::__cxx11::string::~string((string *)local_50);
    }
    else {
      this_local = (FileLogFactory *)operator_new(0x488);
      FileLog::FileLog((FileLog *)this_local,&this->m_path);
    }
  }
  else {
    this_local = (FileLogFactory *)this->m_globalLog;
  }
  return (Log *)this_local;
}

Assistant:

Log* FileLogFactory::create()
{
  if ( ++m_globalLogCount > 1 ) return m_globalLog;

  if ( m_path.size() ) return new FileLog(m_path);

  try
  {

    const Dictionary& settings = m_settings.get();
    std::string path = settings.getString(FILE_LOG_PATH);
    std::string backupPath = path;

    if ( settings.has( FILE_LOG_BACKUP_PATH ) )
      backupPath = settings.getString( FILE_LOG_BACKUP_PATH );

    return m_globalLog = new FileLog( path, backupPath );

  }
  catch( ConfigError& )
  {
    m_globalLogCount--;
    throw;
  }
}